

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O0

string * __thiscall
cmLocalNinjaGenerator::MakeCustomLauncher_abi_cxx11_
          (string *__return_storage_ptr__,cmLocalNinjaGenerator *this,cmCustomCommandGenerator *ccg)

{
  cmMakefile *this_00;
  bool bVar1;
  byte bVar2;
  int iVar3;
  char *pcVar4;
  const_reference pvVar5;
  undefined4 extraout_var;
  cmRulePlaceholderExpander *this_01;
  ulong uVar6;
  auto_ptr<cmRulePlaceholderExpander> local_208;
  auto_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander;
  string local_1f8;
  allocator local_1d1;
  string local_1d0;
  string local_1b0;
  string local_190;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_170;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *outputs;
  string output;
  RuleVariables vars;
  allocator local_49;
  string local_48;
  char *local_28;
  char *property_value;
  cmCustomCommandGenerator *ccg_local;
  cmLocalNinjaGenerator *this_local;
  string *launcher;
  
  this_00 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  property_value = (char *)ccg;
  ccg_local = (cmCustomCommandGenerator *)this;
  this_local = (cmLocalNinjaGenerator *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"RULE_LAUNCH_CUSTOM",&local_49);
  pcVar4 = cmMakefile::GetProperty(this_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  local_28 = pcVar4;
  if ((pcVar4 == (char *)0x0) || (*pcVar4 == '\0')) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    cmRulePlaceholderExpander::RuleVariables::RuleVariables
              ((RuleVariables *)((long)&output.field_2 + 8));
    std::__cxx11::string::string((string *)&outputs);
    local_170 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_
                          ((cmCustomCommandGenerator *)property_value);
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(local_170);
    if (!bVar1) {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](local_170,0);
      std::__cxx11::string::operator=((string *)&outputs,(string *)pvVar5);
      cmCustomCommandGenerator::GetWorkingDirectory_abi_cxx11_
                (&local_190,(cmCustomCommandGenerator *)property_value);
      bVar2 = std::__cxx11::string::empty();
      std::__cxx11::string::~string((string *)&local_190);
      if ((bVar2 & 1) != 0) {
        pcVar4 = cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)this);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_1d0,pcVar4,&local_1d1);
        cmOutputConverter::ConvertToRelativePath
                  (&local_1b0,
                   &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,&local_1d0,(string *)&outputs);
        std::__cxx11::string::operator=((string *)&outputs,(string *)&local_1b0);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
      }
      cmOutputConverter::ConvertToOutputFormat
                (&local_1f8,
                 &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,(string *)&outputs,SHELL);
      std::__cxx11::string::operator=((string *)&outputs,(string *)&local_1f8);
      std::__cxx11::string::~string((string *)&local_1f8);
    }
    std::__cxx11::string::c_str();
    pcVar4 = local_28;
    rulePlaceholderExpander.x_._7_1_ = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,pcVar4,
               (allocator *)((long)&rulePlaceholderExpander.x_ + 6));
    std::allocator<char>::~allocator((allocator<char> *)((long)&rulePlaceholderExpander.x_ + 6));
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__," ");
    iVar3 = (*(this->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[5])
                      ();
    ::cm::auto_ptr<cmRulePlaceholderExpander>::auto_ptr
              (&local_208,(cmRulePlaceholderExpander *)CONCAT44(extraout_var,iVar3));
    this_01 = ::cm::auto_ptr<cmRulePlaceholderExpander>::operator->(&local_208);
    cmRulePlaceholderExpander::ExpandRuleVariables
              (this_01,&(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                        super_cmOutputConverter,__return_storage_ptr__,
               (RuleVariables *)((long)&output.field_2 + 8));
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__," ");
    }
    rulePlaceholderExpander.x_._7_1_ = 1;
    ::cm::auto_ptr<cmRulePlaceholderExpander>::~auto_ptr(&local_208);
    if ((rulePlaceholderExpander.x_._7_1_ & 1) == 0) {
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
    }
    std::__cxx11::string::~string((string *)&outputs);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalNinjaGenerator::MakeCustomLauncher(
  cmCustomCommandGenerator const& ccg)
{
  const char* property_value =
    this->Makefile->GetProperty("RULE_LAUNCH_CUSTOM");

  if (!property_value || !*property_value) {
    return std::string();
  }

  // Expand rules in the empty string.  It may insert the launcher and
  // perform replacements.
  cmRulePlaceholderExpander::RuleVariables vars;

  std::string output;
  const std::vector<std::string>& outputs = ccg.GetOutputs();
  if (!outputs.empty()) {
    output = outputs[0];
    if (ccg.GetWorkingDirectory().empty()) {
      output =
        this->ConvertToRelativePath(this->GetCurrentBinaryDirectory(), output);
    }
    output = this->ConvertToOutputFormat(output, cmOutputConverter::SHELL);
  }
  vars.Output = output.c_str();

  std::string launcher = property_value;
  launcher += " ";

  CM_AUTO_PTR<cmRulePlaceholderExpander> rulePlaceholderExpander(
    this->CreateRulePlaceholderExpander());

  rulePlaceholderExpander->ExpandRuleVariables(this, launcher, vars);
  if (!launcher.empty()) {
    launcher += " ";
  }

  return launcher;
}